

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

size_type __thiscall
lf::uscalfe::FeLagrangeO2Quad<double>::NumRefShapeFunctions
          (FeLagrangeO2Quad<double> *this,dim_t codim,sub_idx_t param_2)

{
  ostream *this_00;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  sub_idx_t local_18;
  dim_t local_14;
  sub_idx_t param_2_local;
  dim_t codim_local;
  FeLagrangeO2Quad<double> *this_local;
  
  if (2 < codim) {
    local_18 = param_2;
    local_14 = codim;
    _param_2_local = this;
    std::__cxx11::stringstream::stringstream(local_1a0);
    this_00 = std::operator<<(local_190,"Illegal codim");
    std::ostream::operator<<(this_00,local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"codim <= 2",&local_1d1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x2f6,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x2f6,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  return 1;
}

Assistant:

[[nodiscard]] size_type NumRefShapeFunctions(
      dim_t codim, sub_idx_t /*subidx*/) const override {
    LF_ASSERT_MSG(codim <= 2, "Illegal codim" << codim);
    return 1;
  }